

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O0

v128 hsum4(v128 x0,v128 x1,v128 x2,v128 x3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  longlong in_RAX;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM3_Qb;
  v128 alVar10;
  v128 t3;
  v128 t2;
  v128 t1;
  v128 t0;
  v128 x3_local;
  v128 x2_local;
  v128 x1_local;
  v128 x0_local;
  
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = in_XMM1_Qa;
  auVar3 = vpunpckldq_avx(auVar2,auVar1);
  auVar5._8_8_ = in_XMM2_Qb;
  auVar5._0_8_ = in_XMM2_Qa;
  auVar4._8_8_ = in_XMM3_Qb;
  auVar4._0_8_ = in_XMM3_Qa;
  auVar4 = vpunpckldq_avx(auVar5,auVar4);
  auVar7._8_8_ = in_XMM0_Qb;
  auVar7._0_8_ = in_XMM0_Qa;
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = in_XMM1_Qa;
  auVar1 = vpunpckhdq_avx(auVar7,auVar6);
  auVar9._8_8_ = in_XMM2_Qb;
  auVar9._0_8_ = in_XMM2_Qa;
  auVar8._8_8_ = in_XMM3_Qb;
  auVar8._0_8_ = in_XMM3_Qa;
  auVar2 = vpunpckhdq_avx(auVar9,auVar8);
  auVar5 = vpunpcklqdq_avx(auVar3,auVar4);
  auVar3 = vpunpckhqdq_avx(auVar3,auVar4);
  auVar4 = vpunpcklqdq_avx(auVar1,auVar2);
  auVar2 = vpunpckhqdq_avx(auVar1,auVar2);
  auVar1 = vpaddd_avx(auVar5,auVar3);
  auVar2 = vpaddd_avx(auVar4,auVar2);
  vpaddd_avx(auVar1,auVar2);
  alVar10[1] = x1[0];
  alVar10[0] = in_RAX;
  return alVar10;
}

Assistant:

static inline v128 hsum4(v128 x0, v128 x1, v128 x2, v128 x3) {
  v128 t0, t1, t2, t3;
  t0 = v128_ziplo_32(x1, x0);
  t1 = v128_ziplo_32(x3, x2);
  t2 = v128_ziphi_32(x1, x0);
  t3 = v128_ziphi_32(x3, x2);
  x0 = v128_ziplo_64(t1, t0);
  x1 = v128_ziphi_64(t1, t0);
  x2 = v128_ziplo_64(t3, t2);
  x3 = v128_ziphi_64(t3, t2);
  return v128_add_32(v128_add_32(x0, x1), v128_add_32(x2, x3));
}